

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_ln(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long in_RDI;
  uint *unaff_retaddr;
  char *new_ext;
  char *in_stack_00000140;
  char *in_stack_00000148;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = is_zero(*(char **)(in_RDI + 8));
  if ((iVar1 == 0) && (iVar1 = get_neg(*(char **)(in_RDI + 8)), iVar1 == 0)) {
    iVar1 = setup_getp_0((CVmObjBigNum *)retval,argc._4_4_,(vm_val_t *)new_ext,unaff_retaddr,
                         (char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      compute_ln_into(in_stack_00000148,in_stack_00000140);
      CVmStack::discard();
    }
    return 1;
  }
  err_throw(0);
}

Assistant:

int CVmObjBigNum::getp_ln(VMG_ vm_obj_id_t self,
                          vm_val_t *retval, uint *argc)
{
    char *new_ext;

    /* zero or negative values are not allowed */
    if (is_zero(ext_) || get_neg(ext_))
        err_throw(VMERR_OUT_OF_RANGE);

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* compute the natural logarithm */
    compute_ln_into(new_ext, ext_);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}